

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborcommon.cpp
# Opt level: O1

QString * __thiscall QCborError::toString(QString *__return_storage_ptr__,QCborError *this)

{
  int iVar1;
  DataPointer *pDVar2;
  char16_t *pcVar3;
  uint *in_RCX;
  uint *puVar4;
  char *pcVar5;
  QString *this_00;
  QByteArrayView ba;
  
  iVar1 = *(int *)this;
  if (iVar1 < 0x200) {
    puVar4 = (uint *)(ulong)(iVar1 - 0x100U);
    if (iVar1 - 0x100U < 8) {
      in_RCX = (uint *)((long)&switchD_002e22c1::switchdataD_004e670c +
                       (long)(int)(&switchD_002e22c1::switchdataD_004e670c)[(long)puVar4]);
      switch(puVar4) {
      case (uint *)0x0:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = L"Data found after the end of the stream";
        (__return_storage_ptr__->d).size = 0x26;
        return __return_storage_ptr__;
      case (uint *)0x1:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = L"Unexpected end of input data (more bytes needed)";
        (__return_storage_ptr__->d).size = 0x30;
        return __return_storage_ptr__;
      case (uint *)0x2:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = L"Invalid CBOR stream: unexpected \'break\' byte";
        (__return_storage_ptr__->d).size = 0x2c;
        return __return_storage_ptr__;
      case (uint *)0x3:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = L"Invalid CBOR stream: unknown type";
        (__return_storage_ptr__->d).size = 0x21;
        return __return_storage_ptr__;
      case (uint *)0x4:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        pcVar3 = L"Invalid CBOR stream: illegal type found";
LAB_002e2464:
        (__return_storage_ptr__->d).ptr = pcVar3;
        (__return_storage_ptr__->d).size = 0x27;
        return __return_storage_ptr__;
      case (uint *)0x5:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr =
             L"Invalid CBOR stream: illegal number encoding (future extension)";
        (__return_storage_ptr__->d).size = 0x3f;
        return __return_storage_ptr__;
      case (uint *)0x6:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = L"Invalid CBOR stream: illegal simple type";
        (__return_storage_ptr__->d).size = 0x28;
        return __return_storage_ptr__;
      case (uint *)0x7:
        pcVar5 = "no more byte or text strings available";
      }
      goto LAB_002e25c5;
    }
    in_RCX = &switchD_002e2332::switchdataD_004e66f8;
    switch(iVar1) {
    case 0:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    case 1:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = L"Unknown error";
      (__return_storage_ptr__->d).size = 0xd;
      return __return_storage_ptr__;
    case 2:
      pcVar5 = 
      "unknown length (attempted to get the length of a map/array/string of indeterminate length";
      goto LAB_002e25c5;
    case 3:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = L"Read past end of buffer (more bytes needed)";
      (__return_storage_ptr__->d).size = 0x2b;
      return __return_storage_ptr__;
    case 4:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = L"Input/Output error";
      (__return_storage_ptr__->d).size = 0x12;
      return __return_storage_ptr__;
    }
  }
  else if (iVar1 < 0x301) {
    puVar4 = (uint *)(ulong)(iVar1 - 0x200U);
    if (iVar1 - 0x200U < 0xc) {
      in_RCX = (uint *)((long)&switchD_002e2299::switchdataD_004e672c +
                       (long)(int)(&switchD_002e2299::switchdataD_004e672c)[(long)puVar4]);
      switch(puVar4) {
      case (uint *)0x0:
        pcVar5 = "unknown simple type";
        break;
      case (uint *)0x1:
        pcVar5 = "unknown tag";
        break;
      case (uint *)0x2:
        pcVar5 = "inappropriate tag for type";
        break;
      case (uint *)0x3:
        pcVar5 = "duplicate keys in object";
        break;
      case (uint *)0x4:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = L"Invalid CBOR stream: invalid UTF-8 text string";
        (__return_storage_ptr__->d).size = 0x2e;
        return __return_storage_ptr__;
      case (uint *)0x5:
        pcVar5 = "excluded type found";
        break;
      case (uint *)0x6:
        pcVar5 = "excluded value found";
        break;
      default:
        pcVar5 = "value encoded in non-canonical form";
        break;
      case (uint *)0x9:
switchD_002e2299_caseD_209:
        pcVar5 = "key in map is not a string";
        break;
      case (uint *)0xa:
        pcVar5 = "map is not sorted";
        break;
      case (uint *)0xb:
        pcVar5 = "map keys are not unique";
      }
      goto LAB_002e25c5;
    }
    if (iVar1 == 0x300) {
      pcVar5 = "too many items added to encoder";
      in_RCX = puVar4;
      goto LAB_002e25c5;
    }
  }
  else if (iVar1 < 0x500) {
    puVar4 = (uint *)(ulong)(iVar1 - 0x400U);
    if (iVar1 - 0x400U < 4) {
      in_RCX = (uint *)((long)&switchD_002e2307::switchdataD_004e675c +
                       (long)(int)(&switchD_002e2307::switchdataD_004e675c)[(long)puVar4]);
      switch(puVar4) {
      case (uint *)0x0:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        pcVar3 = L"Internal limitation: data set too large";
        goto LAB_002e2464;
      case (uint *)0x1:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = L"Internal limitation: data nesting too deep";
        (__return_storage_ptr__->d).size = 0x2a;
        return __return_storage_ptr__;
      case (uint *)0x2:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = L"Internal limitation: unsupported type";
        (__return_storage_ptr__->d).size = 0x25;
        return __return_storage_ptr__;
      case (uint *)0x3:
        pcVar5 = "validation not implemented for the current parser state";
      }
      goto LAB_002e25c5;
    }
    if (iVar1 == 0x301) {
      pcVar5 = "too few items added to encoder";
      in_RCX = puVar4;
      goto LAB_002e25c5;
    }
  }
  else {
    puVar4 = in_RCX;
    if (iVar1 < 0x502) {
      if (iVar1 == 0x500) {
        pcVar5 = "conversion to JSON failed: key in object is an array or map";
        goto LAB_002e25c5;
      }
      if (iVar1 == 0x501) goto switchD_002e2299_caseD_209;
    }
    else {
      if (iVar1 == 0x502) {
        pcVar5 = "conversion to JSON failed: open_memstream unavailable";
        goto LAB_002e25c5;
      }
      if (iVar1 == 0x7fffffff) {
        pcVar5 = "internal error";
        goto LAB_002e25c5;
      }
    }
  }
  pcVar5 = "unknown error";
  in_RCX = puVar4;
LAB_002e25c5:
  this_00 = (QString *)0xffffffffffffffff;
  do {
    pDVar2 = &this_00->d;
    this_00 = (QString *)((long)&(this_00->d).d + 1);
  } while ((pcVar5 + 1)[(long)&pDVar2->d] != '\0');
  ba.m_data = (storage_type *)in_RCX;
  ba.m_size = (qsizetype)pcVar5;
  QString::fromLatin1(__return_storage_ptr__,this_00,ba);
  return __return_storage_ptr__;
}

Assistant:

QString QCborError::toString() const
{
    switch (c) {
    case NoError:
        static_assert(int(NoError) == int(CborNoError));
        return QString();

    case UnknownError:
        static_assert(int(UnknownError) == int(CborUnknownError));
        return QStringLiteral("Unknown error");
    case AdvancePastEnd:
        static_assert(int(AdvancePastEnd) == int(CborErrorAdvancePastEOF));
        return QStringLiteral("Read past end of buffer (more bytes needed)");
    case InputOutputError:
        static_assert(int(InputOutputError) == int(CborErrorIO));
        return QStringLiteral("Input/Output error");
    case GarbageAtEnd:
        static_assert(int(GarbageAtEnd) == int(CborErrorGarbageAtEnd));
        return QStringLiteral("Data found after the end of the stream");
    case EndOfFile:
        static_assert(int(EndOfFile) == int(CborErrorUnexpectedEOF));
        return QStringLiteral("Unexpected end of input data (more bytes needed)");
    case UnexpectedBreak:
        static_assert(int(UnexpectedBreak) == int(CborErrorUnexpectedBreak));
        return QStringLiteral("Invalid CBOR stream: unexpected 'break' byte");
    case UnknownType:
        static_assert(int(UnknownType) == int(CborErrorUnknownType));
        return QStringLiteral("Invalid CBOR stream: unknown type");
    case IllegalType:
        static_assert(int(IllegalType) == int(CborErrorIllegalType));
        return QStringLiteral("Invalid CBOR stream: illegal type found");
    case IllegalNumber:
        static_assert(int(IllegalNumber) == int(CborErrorIllegalNumber));
        return QStringLiteral("Invalid CBOR stream: illegal number encoding (future extension)");
    case IllegalSimpleType:
        static_assert(int(IllegalSimpleType) == int(CborErrorIllegalSimpleType));
        return QStringLiteral("Invalid CBOR stream: illegal simple type");
    case InvalidUtf8String:
        static_assert(int(InvalidUtf8String) == int(CborErrorInvalidUtf8TextString));
        return QStringLiteral("Invalid CBOR stream: invalid UTF-8 text string");
    case DataTooLarge:
        static_assert(int(DataTooLarge) == int(CborErrorDataTooLarge));
        return QStringLiteral("Internal limitation: data set too large");
    case NestingTooDeep:
        static_assert(int(NestingTooDeep) == int(CborErrorNestingTooDeep));
        return QStringLiteral("Internal limitation: data nesting too deep");
    case UnsupportedType:
        static_assert(int(UnsupportedType) == int(CborErrorUnsupportedType));
        return QStringLiteral("Internal limitation: unsupported type");
    }

    // get the error string from TinyCBOR
    CborError err = CborError(int(c));
    return QString::fromLatin1(cbor_error_string(err));
}